

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathFuncs.cpp
# Opt level: O0

float root(float x)

{
  ostream *poVar1;
  float in_XMM0_Da;
  double dVar2;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"sqrt (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_XMM0_Da);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  dVar2 = std::sqrt((double)(ulong)(uint)in_XMM0_Da);
  return SUB84(dVar2,0);
}

Assistant:

float
root (float x)
{
    std::cout << "sqrt (" << x << ")" << std::endl;
    return sqrt (x);
}